

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

void __thiscall
slang::ast::EventListControl::serializeTo(EventListControl *this,ASTSerializer *serializer)

{
  string_view name;
  bool bVar1;
  ASTSerializer *in_RSI;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *in_RDI;
  TimingControl *event;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *__range2;
  TimingControl *in_stack_ffffffffffffffa8;
  ASTSerializer *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  __normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffffd0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0,
             (char *)in_RDI);
  name._M_str = (char *)in_stack_ffffffffffffffd0._M_current;
  name._M_len = in_stack_ffffffffffffffc8;
  ASTSerializer::startArray(in_stack_ffffffffffffffc0,name);
  std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>::begin
            ((span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffffa8);
  std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                        *)in_RSI,
                       (__normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
    ::operator*((__normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                 *)&stack0xffffffffffffffd0);
    ASTSerializer::serialize(in_RSI,in_stack_ffffffffffffffa8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::TimingControl_*const_*,_std::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffd0);
  }
  ASTSerializer::endArray((ASTSerializer *)0x4c18e1);
  return;
}

Assistant:

void EventListControl::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("events");
    for (auto const event : events) {
        serializer.serialize(*event);
    }
    serializer.endArray();
}